

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool string_loadat(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  gravity_object_t *pgVar4;
  int iVar5;
  gravity_range_t *range;
  gravity_fiber_t *pgVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  gravity_value_t gVar16;
  char _buffer [4096];
  ulong uVar10;
  
  pgVar4 = (args->field_1).p;
  uVar7 = args[1].field_1.n;
  if (args[1].isa == gravity_class_int) {
    uVar14 = uVar7 & 0xffffffff;
  }
  else {
    if (args[1].isa != gravity_class_range) {
      memcpy(_buffer,"An integer index or index range is required to access string items.",0x44);
      pgVar6 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar6,_buffer);
      goto LAB_00127da5;
    }
    uVar14 = (ulong)*(uint *)(uVar7 + 0x30);
    uVar7 = (ulong)*(uint *)(uVar7 + 0x38);
  }
  uVar2 = *(uint *)((long)&pgVar4->identifier + 4);
  if ((((int)uVar14 < 0) &&
      (uVar13 = (int)uVar14 + uVar2, uVar14 = (ulong)uVar13, uVar10 = uVar14, (int)uVar13 < 0)) ||
     (uVar13 = (uint)uVar14, uVar10 = uVar14, uVar2 <= uVar13)) {
    pcVar8 = "Out of bounds error: first_index %d beyond bounds 0...%d";
  }
  else {
    uVar9 = ((int)uVar7 >> 0x1f & uVar2) + (int)uVar7;
    uVar10 = (ulong)uVar9;
    if ((-1 < (int)uVar9) && (uVar9 < uVar2)) {
      iVar15 = uVar13 - uVar9;
      if (uVar13 < uVar9) {
        iVar15 = uVar9 - uVar13;
      }
      if (uVar13 <= uVar9) {
        gVar16 = gravity_string_to_value
                           (vm,(char *)((long)&pgVar4->objclass->isa + uVar14),iVar15 + 1U);
LAB_00127e0b:
        gravity_vm_setslot(vm,gVar16,rindex);
        return true;
      }
      pcVar8 = (char *)gravity_calloc(vm,1,(ulong)uVar2);
      if (pcVar8 != (char *)0x0) {
        strncpy(pcVar8,(char *)pgVar4->objclass,(ulong)*(uint *)((long)&pgVar4->identifier + 4));
        iVar3 = *(int *)((long)&pgVar4->identifier + 4);
        lVar12 = 0;
        iVar5 = iVar3;
        while( true ) {
          iVar5 = iVar5 + -1;
          lVar11 = (long)iVar5;
          if (lVar11 <= lVar12) break;
          cVar1 = pcVar8[lVar11];
          pcVar8[lVar11] = pcVar8[lVar12];
          pcVar8[lVar12] = cVar1;
          lVar12 = lVar12 + 1;
        }
        gVar16 = gravity_string_to_value(vm,pcVar8 + (int)(iVar3 + ~uVar13),iVar15 + 1U);
        free(pcVar8);
        goto LAB_00127e0b;
      }
      goto LAB_00127da5;
    }
    pcVar8 = "Out of bounds error: second_index %d beyond bounds 0...%d";
  }
  snprintf(_buffer,0x1000,pcVar8,uVar10,(ulong)(uVar2 - 1));
  pgVar6 = gravity_vm_fiber(vm);
  gravity_fiber_seterror(pgVar6,_buffer);
LAB_00127da5:
  gVar16.field_1.n = 0;
  gVar16.isa = gravity_class_null;
  gravity_vm_setslot(vm,gVar16,rindex);
  return false;
}

Assistant:

static bool string_loadat (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(nargs)
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    gravity_value_t value = GET_VALUE(1);

    int32_t first_index;
    int32_t second_index;

    if (VALUE_ISA_INT(value)) {
        first_index = (int32_t)VALUE_AS_INT(value);
        second_index = first_index;
    }
    else if (VALUE_ISA_RANGE(value)) {
        gravity_range_t *range = VALUE_AS_RANGE(value);
        first_index = (int32_t)range->from;
        second_index = (int32_t)range->to;
    }
    else {
        RETURN_ERROR("An integer index or index range is required to access string items.");
    }

    if (first_index < 0) first_index = string->len + first_index;
    if ((first_index < 0) || ((uint32_t)first_index >= string->len)) RETURN_ERROR("Out of bounds error: first_index %d beyond bounds 0...%d", first_index, string->len-1);

    if (second_index < 0) second_index = string->len + second_index;
    if ((second_index < 0) || ((uint32_t)second_index >= string->len)) RETURN_ERROR("Out of bounds error: second_index %d beyond bounds 0...%d", second_index, string->len-1);

    uint32_t substr_len = first_index < second_index ? second_index - first_index + 1 : first_index - second_index + 1;

    bool is_forward = first_index <= second_index;
    if (!is_forward) {
        char *original = mem_alloc(vm, string->len);
        CHECK_MEM_ALLOC(original);

        // without copying it, we would be modifying the original string
        strncpy((char *)original, string->s, string->len);
        uint32_t original_len = (uint32_t) string->len;

        // Reverse the string, and reverse the indices
        first_index = original_len - first_index -1;

        // reverse the String
        int i = original_len - 1;
        int j = 0;
        char c;
        while (i > j) {
            c = original[i];
            original[i] = original[j];
            original[j] = c;
            --i;
            ++j;
        }

        gravity_value_t s = VALUE_FROM_STRING(vm, original + first_index, substr_len);
        mem_free(original);

        RETURN_VALUE(s, rindex);
    }
    RETURN_VALUE(VALUE_FROM_STRING(vm, string->s + first_index, substr_len), rindex);
}